

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

mat4 * dja::inverse(mat4 *__return_storage_ptr__,mat4 *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  mat4 local_48;
  
  fVar1 = m->m[0].y;
  fVar2 = m->m[1].y;
  fVar3 = m->m[0].z;
  fVar4 = m->m[1].w;
  fVar5 = m->m[0].w;
  fVar6 = m->m[2].z;
  fVar7 = m->m[3].w;
  fVar8 = m->m[2].w;
  fVar9 = m->m[3].y;
  fVar10 = m->m[1].z;
  fVar11 = m->m[3].z;
  fVar28 = fVar6 * fVar7 - fVar8 * fVar11;
  fVar29 = fVar3 * fVar4 - fVar5 * fVar10;
  fVar12 = m->m[2].y;
  fVar24 = fVar12 * fVar7 - fVar8 * fVar9;
  fVar25 = fVar1 * fVar4 - fVar5 * fVar2;
  fVar18 = fVar12 * fVar11 - fVar6 * fVar9;
  fVar19 = fVar1 * fVar10 - fVar3 * fVar2;
  fVar13 = m->m[1].x;
  fVar14 = m->m[3].x;
  fVar15 = m->m[0].x;
  fVar16 = m->m[2].x;
  fVar22 = fVar16 * fVar7 - fVar8 * fVar14;
  fVar23 = fVar15 * fVar4 - fVar5 * fVar13;
  fVar26 = fVar16 * fVar11 - fVar6 * fVar14;
  fVar27 = fVar15 * fVar10 - fVar3 * fVar13;
  fVar20 = fVar16 * fVar9 - fVar12 * fVar14;
  fVar21 = fVar15 * fVar2 - fVar1 * fVar13;
  fVar17 = fVar29 * fVar20 +
           ((fVar19 * fVar22 + fVar23 * fVar18 + (fVar21 * fVar28 - fVar27 * fVar24)) -
           fVar25 * fVar26);
  if ((fVar17 == 0.0) && (!NAN(fVar17))) {
    __assert_fail("det != float_t(0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/dj_algebra/dj_algebra.h"
                  ,0x266,"mat4 dja::inverse(const mat4 &)");
  }
  local_48.m[0].x = fVar4 * fVar18 + fVar2 * fVar28 + -fVar10 * fVar24;
  local_48.m[0].z = fVar7 * fVar19 + fVar9 * fVar29 + -fVar11 * fVar25;
  local_48.m[0].y = -fVar5 * fVar18 + -fVar1 * fVar28 + fVar3 * fVar24;
  local_48.m[0].w = -fVar8 * fVar19 + -fVar12 * fVar29 + fVar6 * fVar25;
  local_48.m[1].x = -fVar4 * fVar26 + -fVar13 * fVar28 + fVar10 * fVar22;
  local_48.m[1].z = -fVar7 * fVar27 + -fVar14 * fVar29 + fVar11 * fVar23;
  local_48.m[1].y = fVar5 * fVar26 + fVar15 * fVar28 + -fVar3 * fVar22;
  local_48.m[1].w = fVar8 * fVar27 + fVar16 * fVar29 + -fVar6 * fVar23;
  local_48.m[2].x = fVar4 * fVar20 + fVar24 * fVar13 + -fVar2 * fVar22;
  local_48.m[2].y = -fVar5 * fVar20 + fVar24 * -fVar15 + fVar22 * fVar1;
  local_48.m[2].z = fVar7 * fVar21 + fVar25 * fVar14 + fVar23 * -fVar9;
  local_48.m[2].w = -fVar8 * fVar21 + fVar25 * -fVar16 + fVar12 * fVar23;
  local_48.m[3].x = fVar20 * -fVar10 + fVar18 * -fVar13 + fVar26 * fVar2;
  local_48.m[3].y = fVar3 * fVar20 + fVar15 * fVar18 + fVar26 * -fVar1;
  local_48.m[3].z = -fVar11 * fVar21 + -fVar14 * fVar19 + fVar27 * fVar9;
  local_48.m[3].w = fVar21 * fVar6 + fVar19 * fVar16 + fVar27 * -fVar12;
  operator*(__return_storage_ptr__,1.0 / fVar17,&local_48);
  return __return_storage_ptr__;
}

Assistant:

mat4 inverse(const mat4& m)
{
    /* based on Laplace expansion theorem */
    const float_t s0 = M00(m) * M11(m) - M10(m) * M01(m);
    const float_t s1 = M00(m) * M12(m) - M10(m) * M02(m);
    const float_t s2 = M00(m) * M13(m) - M10(m) * M03(m);
    const float_t s3 = M01(m) * M12(m) - M11(m) * M02(m);
    const float_t s4 = M01(m) * M13(m) - M11(m) * M03(m);
    const float_t s5 = M02(m) * M13(m) - M12(m) * M03(m);
    const float_t c5 = M22(m) * M33(m) - M32(m) * M23(m);
    const float_t c4 = M21(m) * M33(m) - M31(m) * M23(m);
    const float_t c3 = M21(m) * M32(m) - M31(m) * M22(m);
    const float_t c2 = M20(m) * M33(m) - M30(m) * M23(m);
    const float_t c1 = M20(m) * M32(m) - M30(m) * M22(m);
    const float_t c0 = M20(m) * M31(m) - M30(m) * M21(m);
    const float_t det = s0 * c5 - s1 * c4 + s2 * c3
                      + s3 * c2 - s4 * c1 + s5 * c0;
    DJA_ASSERT(det != float_t(0));
    mat4 a;

    M00(a) = M11(m)*c5 - M12(m)*c4 + M13(m)*c3;
    M01(a) =-M01(m)*c5 + M02(m)*c4 - M03(m)*c3;
    M02(a) = M31(m)*s5 - M32(m)*s4 + M33(m)*s3;
    M03(a) =-M21(m)*s5 + M22(m)*s4 - M23(m)*s3;

    M10(a) =-M10(m)*c5 + M12(m)*c2 - M13(m)*c1;
    M11(a) = M00(m)*c5 - M02(m)*c2 + M03(m)*c1;
    M12(a) =-M30(m)*s5 + M32(m)*s2 - M33(m)*s1;
    M13(a) = M20(m)*s5 - M22(m)*s2 + M23(m)*s1;

    M20(a) = M10(m)*c4 - M11(m)*c2 + M13(m)*c0;
    M21(a) =-M00(m)*c4 + M01(m)*c2 - M03(m)*c0;
    M22(a) = M30(m)*s4 - M31(m)*s2 + M33(m)*s0;
    M23(a) =-M20(m)*s4 + M21(m)*s2 - M23(m)*s0;

    M30(a) =-M10(m)*c3 + M11(m)*c1 - M12(m)*c0;
    M31(a) = M00(m)*c3 - M01(m)*c1 + M02(m)*c0;
    M32(a) =-M30(m)*s3 + M31(m)*s1 - M32(m)*s0;
    M33(a) = M20(m)*s3 - M21(m)*s1 + M22(m)*s0;

    return (float_t(1) / det) * a;
}